

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthExistSet(uint *pRes,uint *pTruth,int nVars,uint uMask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1 + 1;
    do {
      pRes[uVar2 - 2] = pTruth[uVar2 - 2];
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  if (0 < nVars) {
    uVar1 = 0;
    do {
      if ((uMask >> (uVar1 & 0x1f) & 1) != 0) {
        Kit_TruthExist(pRes,nVars,uVar1);
      }
      uVar1 = uVar1 + 1;
    } while (nVars != uVar1);
  }
  return;
}

Assistant:

void Kit_TruthExistSet( unsigned * pRes, unsigned * pTruth, int nVars, unsigned uMask )
{
    int v;
    Kit_TruthCopy( pRes, pTruth, nVars );
    for ( v = 0; v < nVars; v++ )
        if ( uMask & (1 << v) )
            Kit_TruthExist( pRes, nVars, v );
}